

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bound_t __thiscall tchecker::clockbounds::df_solver_t::L(df_solver_t *this,loc_id_t l,clock_id_t x)

{
  db_t *pdVar1;
  bool bVar2;
  integer_t iVar3;
  char *pcVar4;
  int local_3c;
  db_t local_1c;
  clock_id_t local_18;
  db_t db;
  clock_id_t x_local;
  loc_id_t l_local;
  df_solver_t *this_local;
  
  local_18 = x;
  db = (db_t)l;
  if (this->_loc_number <= l) {
    __assert_fail("l < _loc_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd1,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  if (this->_clock_number <= x) {
    __assert_fail("x < _clock_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd2,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  if (((this->_updated_L ^ 0xffU) & 1) == 0) {
    __assert_fail("!_updated_L",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd3,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  bVar2 = tchecker::dbm::is_empty_0(this->_L,(clock_id_t)this->_dim);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!tchecker::dbm::is_empty_0(_L, _dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xd4,
                  "tchecker::clockbounds::bound_t tchecker::clockbounds::df_solver_t::L(tchecker::loc_id_t, tchecker::clock_id_t) const"
                 );
  }
  pdVar1 = this->_L;
  pcVar4 = index(this,(char *)(ulong)(uint)db,local_18);
  local_1c = pdVar1[(long)pcVar4];
  bVar2 = tchecker::dbm::operator==(&local_1c,(db_t *)&tchecker::dbm::LT_INFINITY);
  if (bVar2) {
    local_3c = -0x3fffffff;
  }
  else {
    iVar3 = tchecker::dbm::value(&local_1c);
    local_3c = -iVar3;
  }
  return local_3c;
}

Assistant:

tchecker::clockbounds::bound_t df_solver_t::L(tchecker::loc_id_t l, tchecker::clock_id_t x) const
{
  assert(l < _loc_number);
  assert(x < _clock_number);
  assert(!_updated_L);
  assert(!tchecker::dbm::is_empty_0(_L, _dim));
  tchecker::dbm::db_t db = _L[0 * _dim + index(l, x)];
  return (db == tchecker::dbm::LT_INFINITY ? tchecker::clockbounds::NO_BOUND : -tchecker::dbm::value(db));
}